

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrixVector.h
# Opt level: O0

void Eigen::internal::trmv_selector<6,1>::
     run<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,_1,_1,false>const,_1,_1,false>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,_1,1,1,_1>const>const,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,_1,_1,false>const,_1,1,true>const,_1,1,false>const>const>const>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>>
               (Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,__1,_false>_>
                *lhs,Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
                     *rhs,
               Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
               *dest,Scalar *alpha)

{
  Index *this;
  long lVar1;
  float *pfVar2;
  ScalarWithConstIfNotLvalue *pSVar3;
  Index lhsStride;
  EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
  *this_00;
  size_t size;
  Index _rows;
  TransposeImpl<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
  *pTVar4;
  Index _cols;
  Scalar *_lhs;
  ulong uVar5;
  Scalar *pSVar6;
  Index IVar7;
  Index IVar8;
  long *plVar9;
  Index *pIVar10;
  Scalar SVar11;
  Index local_538;
  float *local_530;
  ScalarWithConstIfNotLvalue *local_528;
  Index local_520;
  EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
  *local_518;
  float *local_510;
  size_t local_508;
  Index local_500;
  TransposeImpl<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
  *local_4f8;
  Index local_4f0;
  Scalar *local_4e8;
  float *local_4e0;
  Scalar *local_4d8;
  Scalar *local_4d0;
  Type local_4c8;
  Type local_430;
  float local_31c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>,__1,_1,_false>_>
  local_318;
  Index local_1e8;
  Index local_1e0;
  long local_1d8;
  Index diagSize;
  undefined1 local_1c0 [8];
  aligned_stack_memory_handler<float> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  Scalar SStack_198;
  gemv_static_vector_if<float,__1,__1,_false> static_rhs;
  ResScalar actualAlpha;
  RhsScalar rhs_alpha;
  LhsScalar lhs_alpha;
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
  *dest_local;
  Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
  *rhs_local;
  Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,__1,_false>_>
  *lhs_local;
  
  pIVar10 = &local_538;
  blas_traits<Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_-1,_false>_>_>
  ::extract((ExtractType *)
            &actualRhs.m_matrix.m_matrix.
             super_BlockImpl<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_true>
             .m_outerStride,lhs);
  blas_traits<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>_>
  ::extract((ExtractType *)&rhs_alpha,rhs);
  SVar11 = blas_traits<Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_-1,_false>_>_>
           ::extractScalarFactor(lhs);
  SStack_198 = blas_traits<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>_>
               ::extractScalarFactor(rhs);
  actualRhsPtr._4_4_ = *alpha * SVar11 * SStack_198;
  uVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
          ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
                  *)&rhs_alpha);
  if (0x3fffffffffffffff < uVar5) {
    throw_std_bad_alloc();
  }
  pSVar6 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Dense>
                   *)&rhs_alpha);
  if (pSVar6 == (Scalar *)0x0) {
    IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
            ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
                    *)&rhs_alpha);
    if ((ulong)(IVar7 * 4) < 0x20001) {
      IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
                      *)&rhs_alpha);
      lVar1 = -(IVar7 * 4 + 0x1eU & 0xfffffffffffffff0);
      pIVar10 = (Index *)((long)&local_538 + lVar1);
      local_4d8 = (Scalar *)((long)&local_530 + lVar1);
    }
    else {
      IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
                      *)&rhs_alpha);
      local_4d8 = (Scalar *)aligned_malloc(IVar7 << 2);
    }
    local_4d0 = local_4d8;
  }
  else {
    local_4d0 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Dense>
                ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Dense>
                        *)&rhs_alpha);
    pIVar10 = &local_538;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_4d0;
  *(undefined8 *)((long)pIVar10 + -8) = 0x25891e;
  pSVar6 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Dense>
                   *)&rhs_alpha);
  if (pSVar6 == (Scalar *)0x0) {
    local_4e0 = (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_4e0 = (float *)0x0;
  }
  local_510 = local_4e0;
  local_518 = (EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
               *)&rhs_alpha;
  *(undefined8 *)((long)pIVar10 + -8) = 0x258960;
  local_508 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
                      *)&rhs_alpha);
  this_00 = local_518;
  *(undefined8 *)((long)pIVar10 + -8) = 0x258973;
  IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
          ::size(this_00);
  size = local_508;
  pfVar2 = local_510;
  *(undefined8 *)((long)pIVar10 + -8) = 0x25899d;
  aligned_stack_memory_handler<float>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_1c0,pfVar2,size,
             0x20000 < (ulong)(IVar7 << 2));
  this = &actualRhs.m_matrix.m_matrix.
          super_BlockImpl<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_true>
          .m_outerStride;
  local_4f8 = (TransposeImpl<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
               *)this;
  *(undefined8 *)((long)pIVar10 + -8) = 0x2589b0;
  local_500 = Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_-1,_false>_>
              ::rows((Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,__1,_false>_>
                      *)this);
  pTVar4 = local_4f8;
  *(undefined8 *)((long)pIVar10 + -8) = 0x2589c3;
  local_4f0 = Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_-1,_false>_>
              ::cols((Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,__1,_false>_>
                      *)pTVar4);
  pTVar4 = local_4f8;
  *(undefined8 *)((long)pIVar10 + -8) = 0x2589d6;
  local_4e8 = TransposeImpl<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Dense>
              ::data(pTVar4);
  *(undefined8 *)((long)pIVar10 + -8) = 0x2589eb;
  local_520 = TransposeImpl<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Dense>
              ::outerStride((TransposeImpl<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
                             *)&actualRhs.m_matrix.m_matrix.
                                super_BlockImpl<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false,_true>
                                .m_outerStride);
  local_530 = (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  *(undefined8 *)((long)pIVar10 + -8) = 0x258a0b;
  local_528 = TransposeImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>,_Eigen::Dense>
              ::data((TransposeImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>,_Eigen::Dense>
                      *)dest);
  *(undefined8 *)((long)pIVar10 + -8) = 0x258a1d;
  IVar8 = TransposeImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>,_Eigen::Dense>
          ::innerStride((TransposeImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>,_Eigen::Dense>
                         *)dest);
  _lhs = local_4e8;
  _cols = local_4f0;
  _rows = local_500;
  lhsStride = local_520;
  pSVar3 = local_528;
  pfVar2 = local_530;
  local_538 = IVar8;
  *(long *)((long)pIVar10 + -0x10) = (long)&actualRhsPtr + 4;
  *(Index *)((long)pIVar10 + -0x18) = IVar8;
  *(ScalarWithConstIfNotLvalue **)((long)pIVar10 + -0x20) = pSVar3;
  *(undefined8 *)((long)pIVar10 + -0x28) = 0x258a7b;
  triangular_matrix_vector_product<long,_6,_float,_false,_float,_false,_1,_0>::run
            (_rows,_cols,_lhs,lhsStride,pfVar2,1,*(ResScalar **)((long)pIVar10 + -0x20),
             *(long *)((long)pIVar10 + -0x18),*(ResScalar **)((long)pIVar10 + -0x10));
  if ((SVar11 != 1.0) || (NAN(SVar11))) {
    *(undefined8 *)((long)pIVar10 + -8) = 0x258aa6;
    local_1e0 = Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_-1,_false>_>
                ::rows(lhs);
    *(undefined8 *)((long)pIVar10 + -8) = 0x258ab6;
    local_1e8 = Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_-1,_false>_>
                ::cols(lhs);
    *(undefined8 *)((long)pIVar10 + -8) = 0x258ad0;
    plVar9 = std::min<long>(&local_1e0,&local_1e8);
    lVar1 = *plVar9;
    local_31c = SVar11 + -1.0;
    local_1d8 = lVar1;
    *(undefined8 *)((long)pIVar10 + -8) = 0x258b0d;
    DenseBase<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>_>
    ::head<long>(&local_430,
                 (DenseBase<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>_>
                  *)rhs,lVar1);
    *(undefined8 *)((long)pIVar10 + -8) = 0x258b29;
    Eigen::operator*(&local_318,&local_31c,(StorageBaseType *)&local_430);
    lVar1 = local_1d8;
    *(undefined8 *)((long)pIVar10 + -8) = 0x258b42;
    DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>_>_>
    ::head<long>(&local_4c8,
                 (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>_>
                  *)dest,lVar1);
    *(undefined8 *)((long)pIVar10 + -8) = 0x258b57;
    MatrixBase<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,1,-1,-1>,1,-1,true>,1,-1,false>>,-1,1,false>>
    ::operator-=((MatrixBase<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>,_1,1,false>>
                  *)&local_4c8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>,__1,_1,_false>_>_>
                  *)&local_318);
  }
  *(undefined8 *)((long)pIVar10 + -8) = 0x258b87;
  aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_1c0);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar      LhsScalar;
    typedef typename Rhs::Scalar      RhsScalar;
    typedef typename Dest::Scalar     ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    LhsScalar lhs_alpha = LhsBlasTraits::extractScalarFactor(lhs);
    RhsScalar rhs_alpha = RhsBlasTraits::extractScalarFactor(rhs);
    ResScalar actualAlpha = alpha * lhs_alpha * rhs_alpha;

    enum {
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    internal::triangular_matrix_vector_product
      <Index,Mode,
       LhsScalar, LhsBlasTraits::NeedToConjugate,
       RhsScalar, RhsBlasTraits::NeedToConjugate,
       RowMajor>
      ::run(actualLhs.rows(),actualLhs.cols(),
            actualLhs.data(),actualLhs.outerStride(),
            actualRhsPtr,1,
            dest.data(),dest.innerStride(),
            actualAlpha);

    if ( ((Mode&UnitDiag)==UnitDiag) && (lhs_alpha!=LhsScalar(1)) )
    {
      Index diagSize = (std::min)(lhs.rows(),lhs.cols());
      dest.head(diagSize) -= (lhs_alpha-LhsScalar(1))*rhs.head(diagSize);
    }
  }